

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall
caffe::TransformationParameter::InternalSwap
          (TransformationParameter *this,TransformationParameter *other)

{
  float fVar1;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  string *psVar5;
  void *pvVar6;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar7;
  void *pvVar8;
  UnknownFieldSet *pUVar9;
  UnknownFieldSet *pUVar10;
  
  google::protobuf::RepeatedField<float>::InternalSwap(&this->mean_value_,&other->mean_value_);
  psVar5 = (this->mean_file_).ptr_;
  (this->mean_file_).ptr_ = (other->mean_file_).ptr_;
  (other->mean_file_).ptr_ = psVar5;
  uVar3 = this->crop_size_;
  this->crop_size_ = other->crop_size_;
  other->crop_size_ = uVar3;
  bVar2 = this->mirror_;
  this->mirror_ = other->mirror_;
  other->mirror_ = bVar2;
  bVar2 = this->force_color_;
  this->force_color_ = other->force_color_;
  other->force_color_ = bVar2;
  bVar2 = this->force_gray_;
  this->force_gray_ = other->force_gray_;
  other->force_gray_ = bVar2;
  fVar1 = this->scale_;
  this->scale_ = other->scale_;
  other->scale_ = fVar1;
  uVar3 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar3;
  pvVar8 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  pvVar6 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar8 & 1) == 0) {
    if (((ulong)pvVar6 & 1) == 0) goto LAB_00407a41;
LAB_00407a29:
    pUVar10 = (UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar6 & 1) != 0) goto LAB_00407a29;
    pUVar10 = google::protobuf::internal::
              InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ::mutable_unknown_fields_slow
                        (&(other->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        );
    pvVar8 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
  }
  if (((ulong)pvVar8 & 1) == 0) {
    pUVar9 = google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
  }
  else {
    pUVar9 = (UnknownFieldSet *)((ulong)pvVar8 & 0xfffffffffffffffe);
  }
  pvVar7 = pUVar9->fields_;
  pUVar9->fields_ = pUVar10->fields_;
  pUVar10->fields_ = pvVar7;
LAB_00407a41:
  iVar4 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar4;
  return;
}

Assistant:

void TransformationParameter::InternalSwap(TransformationParameter* other) {
  mean_value_.InternalSwap(&other->mean_value_);
  mean_file_.Swap(&other->mean_file_);
  std::swap(crop_size_, other->crop_size_);
  std::swap(mirror_, other->mirror_);
  std::swap(force_color_, other->force_color_);
  std::swap(force_gray_, other->force_gray_);
  std::swap(scale_, other->scale_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}